

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler::handle_terminator
          (AnalyzeVariableScopeAccessHandler *this,SPIRBlock *block)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRBlock *block_local;
  AnalyzeVariableScopeAccessHandler *this_local;
  
  iVar1 = *(int *)&(block->super_IVariant).field_0xc;
  if (iVar1 - 2U < 2) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->condition);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(block->super_IVariant).self);
    notify_variable_access(this,uVar2,uVar3);
  }
  else if ((iVar1 == 4) &&
          (uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->return_value),
          uVar2 != 0)) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->return_value);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(block->super_IVariant).self);
    notify_variable_access(this,uVar2,uVar3);
  }
  return true;
}

Assistant:

bool Compiler::AnalyzeVariableScopeAccessHandler::handle_terminator(const SPIRBlock &block)
{
	switch (block.terminator)
	{
	case SPIRBlock::Return:
		if (block.return_value)
			notify_variable_access(block.return_value, block.self);
		break;

	case SPIRBlock::Select:
	case SPIRBlock::MultiSelect:
		notify_variable_access(block.condition, block.self);
		break;

	default:
		break;
	}

	return true;
}